

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O2

range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
 __thiscall
tchecker::system::proc_edges_maps_t::edges
          (proc_edges_maps_t *this,process_id_t pid,event_id_t event_id)

{
  pointer pvVar1;
  long lVar2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *prVar3;
  ulong uVar4;
  
  uVar4 = (ulong)pid;
  pvVar1 = (this->_proc_event_to_edges).
           super__Vector_base<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar3 = (range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
            *)&_empty_edges;
  if (uVar4 < (ulong)(((long)(this->_proc_event_to_edges).
                             super__Vector_base<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>,_std::allocator<std::vector<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) {
    lVar2 = *(long *)&pvVar1[uVar4].
                      super__Vector_base<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    if ((ulong)event_id <
        (ulong)(((long)*(pointer *)
                        ((long)&pvVar1[uVar4].
                                super__Vector_base<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar2) / 0x18)) {
      prVar3 = (range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                *)(lVar2 + (ulong)event_id * 0x18);
    }
  }
  return *prVar3;
}

Assistant:

tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>
proc_edges_maps_t::edges(tchecker::process_id_t pid, tchecker::event_id_t event_id) const
{
  if (pid >= _proc_event_to_edges.size() || event_id >= _proc_event_to_edges[pid].size())
    return tchecker::make_range<tchecker::system::edges_collection_const_iterator_t>(_empty_edges.begin(), _empty_edges.end());
  return tchecker::make_range<tchecker::system::edges_collection_const_iterator_t>(_proc_event_to_edges[pid][event_id].begin(),
                                                                                   _proc_event_to_edges[pid][event_id].end());
}